

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_biased.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::profiling_internal::ExponentialBiased::Initialize(ExponentialBiased *this)

{
  ulong uVar1;
  int iVar2;
  
  LOCK();
  UNLOCK();
  uVar1 = (long)&this->rng_ +
          (ulong)(uint)Initialize::global_rand.super___atomic_base<unsigned_int>._M_i;
  iVar2 = 0x14;
  do {
    uVar1 = uVar1 * 0x5deece66d + 0xb & 0xffffffffffff;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  Initialize::global_rand.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)
       (__atomic_base<unsigned_int>)
       (Initialize::global_rand.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
  this->rng_ = uVar1;
  this->initialized_ = true;
  return;
}

Assistant:

void ExponentialBiased::Initialize() {
  // We don't get well distributed numbers from `this` so we call NextRandom() a
  // bunch to mush the bits around. We use a global_rand to handle the case
  // where the same thread (by memory address) gets created and destroyed
  // repeatedly.
  ABSL_CONST_INIT static std::atomic<uint32_t> global_rand(0);
  uint64_t r = reinterpret_cast<uint64_t>(this) +
               global_rand.fetch_add(1, std::memory_order_relaxed);
  for (int i = 0; i < 20; ++i) {
    r = NextRandom(r);
  }
  rng_ = r;
  initialized_ = true;
}